

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

Array<asl::InetAddress> __thiscall asl::InetAddress::lookup(InetAddress *this,String *host)

{
  addrinfo *paVar1;
  bool bVar2;
  int iVar3;
  addrinfo **__pai;
  anon_union_16_2_78e7fdac_for_String_2 *__name;
  InetAddress local_60;
  addrinfo *info;
  addrinfo hints;
  
  Array<asl::InetAddress>::Array((Array<asl::InetAddress> *)this);
  hints.ai_flags = 0;
  hints.ai_family = 0;
  hints.ai_socktype = 0;
  hints.ai_protocol = 0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_canonname = (char *)0x0;
  hints.ai_next = (addrinfo *)0x0;
  bVar2 = String::contains(host,':');
  hints.ai_family = (uint)bVar2 * 8 + 2;
  if (host->_size == 0) {
    __name = &host->field_2;
  }
  else {
    __name = (anon_union_16_2_78e7fdac_for_String_2 *)(host->field_2)._str;
  }
  __pai = (addrinfo **)&info;
  iVar3 = getaddrinfo(__name->_space,(char *)0x0,(addrinfo *)&hints,__pai);
  if (iVar3 == 0) {
    while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
      InetAddress(&local_60);
      local_60._type = (paVar1->ai_family != 2) + IPv4;
      Array<unsigned_char>::resize(&local_60._data,paVar1->ai_addrlen);
      memcpy(local_60._data._a,paVar1->ai_addr,(ulong)paVar1->ai_addrlen);
      bVar2 = Array<asl::InetAddress>::contains((Array<asl::InetAddress> *)this,&local_60);
      if (!bVar2) {
        if (local_60._type == IPv4) {
          Array<asl::InetAddress>::insert((Array<asl::InetAddress> *)this,0,&local_60);
        }
        else {
          Array<asl::InetAddress>::operator<<((Array<asl::InetAddress> *)this,&local_60);
        }
      }
      Array<unsigned_char>::~Array(&local_60._data);
      __pai = &paVar1->ai_next;
    }
    freeaddrinfo((addrinfo *)info);
  }
  return (Array<asl::InetAddress>)this;
}

Assistant:

Array<InetAddress> InetAddress::lookup(const String& host)
{
#ifdef _WIN32
	if (!g_wsaStarted) startWSA();
#endif
	Array<InetAddress> addresses;
	addrinfo hints;
	addrinfo* info;
	memset(&hints, 0, sizeof(addrinfo));
	hints.ai_family = host.contains(':') ? AF_INET6 : AF_TYPE;

	int s = getaddrinfo(host, NULL, &hints, &info);
	if (s != 0)
	{
		verbose_print("Cannot resolve %s\n", *host);
		return addresses;
	}
	for (const addrinfo* ai = info; ai; ai = ai->ai_next)
	{
		InetAddress a;
		if (ai->ai_family == AF_INET)
			a._type = IPv4;
		else
			a._type = IPv6;
		a.resize((int)ai->ai_addrlen);
		memcpy(a.ptr(), ai->ai_addr, ai->ai_addrlen);
		if (!addresses.contains(a))
		{
			if (a._type == IPv4)
				addresses.insert(0, a);
			else
				addresses << a;
		}
	}
	freeaddrinfo(info);
	return addresses;
}